

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O3

bool shm::move_to_tid_numa(pid_t thread_id,void *ptr,size_t nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  cpu_set_t *__cpuset;
  void *pvVar5;
  void *__s;
  void *__ptr;
  ostream *poVar6;
  SHMException *this;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __count;
  bool bVar10;
  float fVar11;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar4 = sysconf(0x1e);
  if ((ulong)ptr % uVar4 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Variable \'ptr\' must be page aligned, currently it is(",0x35);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"), off please fix...exiting!!\n",0x1e);
    this = (SHMException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    SHMException::SHMException(this,&local_1d8);
    *(undefined ***)this = &PTR__SHMException_00106d88;
    __cxa_throw(this,&TemplateSHMException<2>::typeinfo,SHMException::~SHMException);
  }
  iVar1 = numa_available();
  bVar10 = true;
  if ((iVar1 != -1) && (iVar1 = numa_num_configured_nodes(), iVar1 != 1)) {
    iVar1 = sched_getcpu();
    numa_node_of_cpu(iVar1);
    iVar1 = get_nprocs_conf();
    __count = (size_t)iVar1;
    __cpuset = __sched_cpualloc(__count);
    if (__cpuset == (cpu_set_t *)0x0) {
      __assert_fail("cpuset != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/RaftLib[P]shm/lib/shm.cpp"
                    ,0x290,
                    "static bool shm::move_to_tid_numa(const pid_t, void *, const std::size_t)");
    }
    uVar8 = __count + 0x3f >> 3 & 0xfffffffffffffff8;
    memset(__cpuset,0,uVar8);
    iVar2 = sched_getaffinity(thread_id,uVar8,__cpuset);
    if (iVar2 == 0) {
      if (0 < iVar1) {
        uVar8 = 0;
        iVar1 = 0;
        iVar2 = 0;
        do {
          if ((uVar8 < 0x400) && ((__cpuset->__bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
            iVar3 = numa_node_of_cpu(uVar8 & 0xffffffff);
            bVar10 = iVar3 != -1;
            if (!bVar10) {
              iVar3 = 0;
            }
            iVar2 = iVar2 + (uint)bVar10;
            iVar1 = iVar1 + iVar3;
          }
          uVar8 = uVar8 + 1;
        } while (__count != uVar8);
        __cpuset = (cpu_set_t *)((long)iVar1 / (long)iVar2 & 0xffffffff);
      }
      fVar11 = ceilf((float)nbytes / (float)(long)uVar4);
      uVar9 = (long)(fVar11 - 9.223372e+18) & (long)fVar11 >> 0x3f | (long)fVar11;
      uVar8 = -(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4;
      pvVar5 = operator_new__(uVar8);
      __s = operator_new__(uVar8);
      __ptr = malloc(uVar9 * 8);
      if (uVar9 != 0) {
        memset(__s,0xff,uVar9 * 4);
        uVar8 = 0;
        lVar7 = 0;
        do {
          *(int *)((long)pvVar5 + uVar8 * 4) = (int)__cpuset;
          *(long *)((long)__ptr + uVar8 * 8) = (long)ptr + (long)(int)lVar7;
          uVar8 = uVar8 + 1;
          lVar7 = (long)(int)lVar7 + uVar4;
        } while (uVar9 != uVar8);
      }
      move_pages(thread_id,uVar9,__ptr,pvVar5,__s,2);
      operator_delete__(pvVar5);
      operator_delete__(__s);
      free(__ptr);
    }
    else {
      perror("Failed to get affinity for calling thread!");
    }
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool
shm::move_to_tid_numa( const pid_t thread_id,
                       void *ptr,
                       const std::size_t nbytes )
{
#if __linux && ( PLATFORM_HAS_NUMA == 1 )
   /** check alignment of pages first **/
   const auto page_size( sysconf( _SC_PAGESIZE ) );
   
   const auto ptr_addr( 
      reinterpret_cast< std::uintptr_t >( ptr ) );
   if( (ptr_addr % page_size) != 0 )
   {
#if USE_CPP_EXCEPTIONS==1      
      std::stringstream ss;
      ss << "Variable 'ptr' must be page aligned, currently it is(" << 
       ptr_addr % page_size << "), off please fix...exiting!!\n";
      throw page_alignment_exception( ss.str() );
#else
      return( false );
#endif
   }

   /** check to see if NUMA avail **/
   if( numa_available() == -1 )
   {
      return( true );
   }
   /** first check to see if there is more than one numa node **/
   const auto num_numa( numa_num_configured_nodes() );
   if( num_numa == 1 )
   {
      /** no point in continuing **/
      return( true );
   }

   /** RETURN VAL HERE */
   bool moved( false );
   /** get the numa node of the calling thread **/
   const auto local_node( numa_node_of_cpu( sched_getcpu() ) );      
   /** get numa node that 'pages' is on **/
   /**
    * Note: only way I could figure out how to do this was get a cpu
    * set, we'll check to see how many CPU's are in the CPU set of 
    * the thread, then we'll see if all those CPU's are on the 
    * same NUMA node, if they are then we'll check to see if the
    * alloc is on the same node, otherwise we'll move the pages to that
    * node.  The interesting case comes when there are multiple
    * CPUs per set and multiple possible NUMA nodes to choose from.  The simple
    * answer, the one I'm taking a the moment is that we can't 
    * really decide in this function.  I think in the future it'd
    * be good to have a profiler decide the shortest latency and
    * highest bandwidth for long running programs at startup and 
    * do some sort of graph matching.
    */
   cpu_set_t *cpuset( nullptr );
   /** we want set to include all cpus **/
   const auto num_cpus_alloc( get_nprocs_conf() );
   std::size_t cpu_allocate_size( -1 );
#if (__GLIBC_MINOR__ > 9 ) && (__GLIBC__ == 2)
   cpuset = CPU_ALLOC( num_cpus_alloc );
   assert( cpuset != nullptr );
   cpu_allocate_size = CPU_ALLOC_SIZE( num_cpus_alloc );
   CPU_ZERO_S( cpu_allocate_size, cpuset );
#else
   cpu_allocate_size = sizeof( cpu_set_t );
   cpuset = reinterpret_cast< cpu_set_t* >( malloc( cpu_allocate_size ) );
   assert( cpuset != nullptr );
   CPU_ZERO( cpuset );
#endif
   /** now get affinity **/
   if( sched_getaffinity( thread_id, cpu_allocate_size, cpuset ) != 0 )
   {
      perror( "Failed to get affinity for calling thread!" );
      return( false );
   }
   /**
    * NOTE: for the moment we're using an extremely simplistic
    * distance metric, we should probably be using the numa_distance
    * combined with the actual latancy/bandwidth between the 
    * processor cores.
    */
   auto numa_node_count( 0 );
   auto denom( 0 );
   for( auto p_index( 0 ); p_index < num_cpus_alloc; p_index++ )
   {
      if( CPU_ISSET( p_index /* cpu */, cpuset ) )
      {
         const auto ret_val( numa_node_of_cpu( p_index ) );
         if( ret_val != -1 )
         {
            numa_node_count += ret_val;
            denom++;
         }
      }
   }
   const auto target_node( numa_node_count / denom );

   /** we need to know how many pages we have **/
   const auto num_pages(
      static_cast< std::size_t >(
      std::ceil( 
      static_cast< float >( nbytes ) / static_cast< float >( page_size ) ) ) );
   using int_t = std::int32_t;
   int_t *mem_node  ( new int_t[ num_pages ] );
   int_t *mem_status( new int_t[ num_pages ] );
   void **page_ptr = (void**)malloc( sizeof( void* ) * num_pages );
   char *temp_ptr( reinterpret_cast< char* >( ptr ) );
   for( auto node_index( 0 ), 
             page_index( 0 )                       /** init **/; 
             node_index < num_pages                /** cond **/; 
             node_index++, page_index += page_size /** incr **/)
   {
      mem_node  [ node_index ] = target_node;
      mem_status[ node_index ] = -1;
      page_ptr[ node_index ] = (void*)&temp_ptr[ page_index ];
   }
   if( move_pages(   thread_id /** thread we want to move for **/,
                     num_pages /** total number of pages **/,
                     page_ptr  /** pointers to the start of each page **/,
                     mem_node  /** node we want to move to **/,
                     mem_status/** status flags, check for debug **/,
                     MPOL_MF_MOVE ) != 0 )
   {
#if DEBUG
      perror( "failed to move pages, non-fatal error but results may vary.");
      /** TODO, re-code all status flag checks..accidentally over wrote **/
#endif
      moved = false;
   }
   delete[]( mem_node );
   delete[]( mem_status );
   free( page_ptr );
   return( moved );
#else /** no NUMA avail **/
   return( false );
#endif
}